

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::SGXMLScanner::normalizeAttRawValue
          (SGXMLScanner *this,XMLCh *attrName,XMLCh *value,XMLBuffer *toFill)

{
  bool bVar1;
  XMLCh toAppend;
  
  toFill->fIndex = 0;
  bVar1 = true;
  do {
    toAppend = *value;
    if (toAppend == L'<') {
      bVar1 = false;
      XMLScanner::emitError
                (&this->super_XMLScanner,BracketInAttrValue,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
LAB_002b7811:
      if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)toAppend]
          < '\0') {
        toAppend = L' ';
      }
    }
    else {
      if (toAppend != L'\xffff') {
        if (toAppend == L'\0') {
          return bVar1;
        }
        goto LAB_002b7811;
      }
      toAppend = value[1];
      value = value + 1;
    }
    XMLBuffer::append(toFill,toAppend);
    value = value + 1;
  } while( true );
}

Assistant:

bool SGXMLScanner::normalizeAttRawValue( const   XMLCh* const        attrName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    bool escaped;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;
    while (*srcPtr)
    {
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        nextCh = *srcPtr;
        escaped = (nextCh == 0xFFFF);
        if (escaped)
            nextCh = *++srcPtr;

        //  If its not escaped, then make sure its not a < character, which is
        //  not allowed in attribute values.
        if (!escaped && (*srcPtr == chOpenAngle))
        {
            emitError(XMLErrs::BracketInAttrValue, attrName);
            retVal = false;
        }

        if (!escaped)
        {
            //  NOTE: Yes this is a little redundant in that a 0x20 is
            //  replaced with an 0x20. But its faster to do this (I think)
            //  than checking for 9, A, and D separately.
            if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                nextCh = chSpace;
        }

        // Add this char to the target buffer
        toFill.append(nextCh);

        // And move up to the next character in the source
        srcPtr++;
    }
    return retVal;
}